

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

LONG __thiscall
CorUnix::CPalSynchronizationManager::DoMonitorProcesses
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  int iVar1;
  MonitoredProcessesListNode *pMVar2;
  _MonitoredProcessesListNode *p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ObjectDomain OVar7;
  int local_38;
  bool fSharedSynchLockIsNeeded;
  bool fMonitoredProcessesLock;
  bool fSharedSynchLock;
  bool fLocalSynchLock;
  LONG lRemovingCount;
  LONG lInitialNodeCount;
  MonitoredProcessesListNode *pNext;
  MonitoredProcessesListNode *pPrev;
  MonitoredProcessesListNode *pNode;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  pNext = (MonitoredProcessesListNode *)0x0;
  local_38 = 0;
  bVar5 = false;
  bVar4 = false;
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  iVar1 = this->m_lMonitoredProcessesCount;
  pPrev = this->m_pmplnMonitoredProcesses;
  while (pPrev != (MonitoredProcessesListNode *)0x0) {
    pMVar2 = pPrev->pNext;
    bVar6 = HasProcessExited(pPrev->dwPid,&pPrev->dwExitCode,&pPrev->fIsActualExitCode);
    if (bVar6) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if (pNext == (MonitoredProcessesListNode *)0x0) {
        this->m_pmplnMonitoredProcesses = pMVar2;
      }
      else {
        pNext->pNext = pMVar2;
      }
      this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + -1;
      pPrev->pNext = this->m_pmplnExitedNodes;
      this->m_pmplnExitedNodes = pPrev;
      local_38 = local_38 + 1;
      pPrev = pMVar2;
    }
    else {
      pNext = pPrev;
      pPrev = pMVar2;
    }
  }
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  bVar6 = false;
  if (0 < local_38) {
    AcquireLocalSynchLock(pthrCurrent);
    bVar5 = true;
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    bVar4 = false;
    for (pPrev = this->m_pmplnExitedNodes; pPrev != (MonitoredProcessesListNode *)0x0;
        pPrev = pPrev->pNext) {
      OVar7 = CSynchData::GetObjectDomain(pPrev->psdSynchData);
      if (OVar7 == SharedObject) {
        bVar4 = true;
        break;
      }
    }
    if (bVar4) {
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      AcquireSharedSynchLock(pthrCurrent);
      InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    }
    bVar6 = true;
    pPrev = this->m_pmplnExitedNodes;
    this->m_pmplnExitedNodes = (MonitoredProcessesListNode *)0x0;
    while (pPrev != (MonitoredProcessesListNode *)0x0) {
      p_Var3 = pPrev->pNext;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if ((pPrev->fIsActualExitCode & 1U) != 0) {
        *(DWORD *)(pPrev->pProcLocalData + 8) = pPrev->dwExitCode;
      }
      *(undefined4 *)(pPrev->pProcLocalData + 4) = 3;
      CSynchData::SetSignalCount(pPrev->psdSynchData,1);
      CSynchData::ReleaseAllLocalWaiters(pPrev->psdSynchData,pthrCurrent);
      CSynchData::Release(pPrev->psdSynchData,pthrCurrent);
      InternalDelete<CorUnix::CPalSynchronizationManager::_MonitoredProcessesListNode>(pPrev);
      pPrev = p_Var3;
    }
  }
  if (bVar6) {
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  if (bVar4) {
    ReleaseSharedSynchLock(pthrCurrent);
  }
  if (bVar5) {
    ReleaseLocalSynchLock(pthrCurrent);
  }
  return iVar1 - local_38;
}

Assistant:

LONG CPalSynchronizationManager::DoMonitorProcesses(
        CPalThread * pthrCurrent)
    {
        MonitoredProcessesListNode * pNode, * pPrev = NULL, * pNext;
        LONG lInitialNodeCount;
        LONG lRemovingCount = 0;
        bool fLocalSynchLock = false;
        bool fSharedSynchLock = false;
        bool fMonitoredProcessesLock = false;

        // Note: we first need to grab the monitored processes lock to walk
        //       the list of monitored processes, and then, if there is any
        //       which exited, to grab the synchronization lock(s) to signal
        //       the process object. Anyway we cannot grab the synchronization
        //       lock(s) while holding the monitored processes lock; that
        //       would cause deadlock, since RegisterProcessForMonitoring and
        //       UnRegisterProcessForMonitoring call stacks grab the locks
        //       in the opposite order. Grabbing the synch lock(s) first (and
        //       therefore all the times) would cause unacceptable contention
        //       (process monitoring is done in polling mode).
        //       Therefore we need to remove list nodes for processes that
        //       exited copying them to the exited array, while holding only
        //       the monitored processes lock, and then to signal them from that
        //       array holding synch lock(s) and monitored processes lock,
        //       acquired in this order. Holding again the monitored processes
        //       lock is needed in order to support object promotion.

        // Grab the monitored processes lock
        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        lInitialNodeCount = m_lMonitoredProcessesCount;

        pNode = m_pmplnMonitoredProcesses;
        while (pNode)
        {
            pNext = pNode->pNext;

            if (HasProcessExited(pNode->dwPid,
                                 &pNode->dwExitCode,
                                 &pNode->fIsActualExitCode))
            {
                TRACE("Process %u exited with return code %u\n",
                      pNode->dwPid,
                      pNode->fIsActualExitCode ? "actual" : "guessed",
                      pNode->dwExitCode);

                if (NULL != pPrev)
                {
                    pPrev->pNext = pNext;
                }
                else
                {
                    m_pmplnMonitoredProcesses = pNext;
                }
                m_lMonitoredProcessesCount--;

                // Insert in the list of nodes for exited processes
                pNode->pNext = m_pmplnExitedNodes;
                m_pmplnExitedNodes = pNode;
                lRemovingCount++;
            }
            else
            {
                pPrev = pNode;
            }

            // Go to the next
            pNode = pNext;
        }

        // Release the monitored processes lock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (lRemovingCount > 0)
        {
            // First grab the local synch lock
            AcquireLocalSynchLock(pthrCurrent);
            fLocalSynchLock = true;

            // Acquire the monitored processes lock
            InternalEnterCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
            fMonitoredProcessesLock = true;

            if (!fSharedSynchLock)
            {
                bool fSharedSynchLockIsNeeded = false;

                // See if the shared lock is needed
                pNode = m_pmplnExitedNodes;
                while (pNode)
                {
                    if (SharedObject == pNode->psdSynchData->GetObjectDomain())
                    {
                        fSharedSynchLockIsNeeded = true;
                        break;
                    }

                    pNode = pNode->pNext;
                }

                if (fSharedSynchLockIsNeeded)
                {
                    // Release the monitored processes lock
                    InternalLeaveCriticalSection(pthrCurrent,
                                                 &s_csMonitoredProcessesLock);
                    fMonitoredProcessesLock = false;

                    // Acquire the shared synch lock
                    AcquireSharedSynchLock(pthrCurrent);
                    fSharedSynchLock = true;

                    // Acquire again the monitored processes lock
                    InternalEnterCriticalSection(pthrCurrent,
                                                 &s_csMonitoredProcessesLock);
                    fMonitoredProcessesLock = true;
                }
            }

            // Start from the beginning of the exited processes list
            pNode = m_pmplnExitedNodes;

            // Invalidate the list
            m_pmplnExitedNodes = NULL;

            while (pNode)
            {
                pNext = pNode->pNext;

                TRACE("Process pid=%u exited with exitcode=%u\n",
                      pNode->dwPid, pNode->dwExitCode);

                // Store the exit code in the process local data
                if (pNode->fIsActualExitCode)
                {
                    pNode->pProcLocalData->dwExitCode = pNode->dwExitCode;
                }

                // Set process status to PS_DONE
                pNode->pProcLocalData->ps = PS_DONE;

                // Set signal count
                pNode->psdSynchData->SetSignalCount(1);

                // Releasing all local waiters
                //
                // We just called directly in CSynchData::SetSignalCount(), so
                // we need to take care of waking up waiting threads according
                // to the Process object semantics (i.e. every thread must be
                // awakend). Anyway if a process object is shared among two or
                // more processes and threads from different processes are
                // waiting on it, the object will be registered for monitoring
                // in each of the processes. As result its signal count will
                // be set to one more times (which is not a problem, given the
                // process object semantics) and each worker thread will wake
                // up waiting threads. Therefore we need to make sure that each
                // worker wakes up only threads in its own process: we do that
                // by calling ReleaseAllLocalWaiters
                pNode->psdSynchData->ReleaseAllLocalWaiters(pthrCurrent);

                // Release the reference to the SynchData
                pNode->psdSynchData->Release(pthrCurrent);

                // Delete the node
                InternalDelete(pNode);

                // Go to the next
                pNode = pNext;
            }
        }

        if (fMonitoredProcessesLock)
        {
            // Release the monitored processes lock
            InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        }
        if (fSharedSynchLock)
        {
            // Release the shared synch lock
            ReleaseSharedSynchLock(pthrCurrent);
        }
        if (fLocalSynchLock)
        {
            // Release the local synch lock
            ReleaseLocalSynchLock(pthrCurrent);
        }

        return (lInitialNodeCount - lRemovingCount);
    }